

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_descending_eig(REF_DBL *d)

{
  double dVar1;
  undefined8 uVar2;
  REF_DBL RVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = *d;
  dVar1 = d[1];
  dVar5 = dVar7;
  dVar6 = dVar1;
  if (dVar7 < dVar1) {
    *d = dVar1;
    d[1] = dVar7;
    for (lVar4 = -0x18; dVar5 = dVar1, dVar6 = dVar7, lVar4 != 0; lVar4 = lVar4 + 8) {
      uVar2 = *(undefined8 *)((long)d + lVar4 + 0x30);
      *(undefined8 *)((long)d + lVar4 + 0x30) = *(undefined8 *)((long)d + lVar4 + 0x48);
      *(undefined8 *)((long)d + lVar4 + 0x48) = uVar2;
    }
  }
  dVar7 = d[2];
  if (dVar5 < dVar7) {
    *d = dVar7;
    d[2] = dVar5;
    for (lVar4 = 0; dVar7 = dVar5, lVar4 != 3; lVar4 = lVar4 + 1) {
      RVar3 = d[lVar4 + 3];
      d[lVar4 + 3] = d[lVar4 + 9];
      d[lVar4 + 9] = RVar3;
    }
  }
  if (dVar6 < dVar7) {
    d[1] = dVar7;
    d[2] = dVar6;
    for (lVar4 = -0x18; lVar4 != 0; lVar4 = lVar4 + 8) {
      uVar2 = *(undefined8 *)((long)d + lVar4 + 0x48);
      *(undefined8 *)((long)d + lVar4 + 0x48) = *(undefined8 *)((long)d + lVar4 + 0x60);
      *(undefined8 *)((long)d + lVar4 + 0x60) = uVar2;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_descending_eig(REF_DBL *d) {
  REF_DBL temp;
  REF_INT i;

  if (ref_matrix_eig(d, 1) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 0)) {
    temp = ref_matrix_eig(d, 0);
    ref_matrix_eig(d, 0) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 0);
      ref_matrix_vec(d, i, 0) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  if (ref_matrix_eig(d, 2) > ref_matrix_eig(d, 1)) {
    temp = ref_matrix_eig(d, 1);
    ref_matrix_eig(d, 1) = ref_matrix_eig(d, 2);
    ref_matrix_eig(d, 2) = temp;
    for (i = 0; i < 3; i++) {
      temp = ref_matrix_vec(d, i, 1);
      ref_matrix_vec(d, i, 1) = ref_matrix_vec(d, i, 2);
      ref_matrix_vec(d, i, 2) = temp;
    }
  }

  return REF_SUCCESS;
}